

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

exr_result_t validate_req_attr(exr_context_t f,exr_priv_part_t curpart,int adddefault)

{
  undefined8 *puVar1;
  uint8_t *puVar2;
  exr_result_t eVar3;
  int in_EDX;
  uint8_t **in_RSI;
  long in_RDI;
  exr_attribute_list_t *unaff_retaddr;
  exr_context_t in_stack_00000008;
  exr_attr_v2f_t defswc;
  exr_attr_box2i_t defdw_1;
  exr_attr_box2i_t defdw;
  exr_result_t rv;
  undefined8 local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  uint8_t *local_30;
  uint8_t *local_28;
  exr_result_t local_20;
  int local_1c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_20 = 0;
  local_1c = in_EDX;
  if (in_RSI[5] == (uint8_t *)0x0) {
    if (in_EDX == 0) {
      eVar3 = (**(code **)(in_RDI + 0x48))(in_RDI,0xd,"\'compression\' attribute not found");
      return eVar3;
    }
    eVar3 = exr_attr_list_add_static_name
                      (in_stack_00000008,unaff_retaddr,
                       (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (exr_attribute_type_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,in_RSI,
                       (exr_attribute_t **)defdw_1.max);
    if (eVar3 != 0) {
      return eVar3;
    }
    in_RSI[5][0x18] = '\x03';
    *(undefined4 *)(in_RSI + 0x16) = 3;
  }
  else if (*(int *)(in_RSI[5] + 0x14) != 5) {
    eVar3 = (**(code **)(in_RDI + 0x48))
                      (in_RDI,0x10,"\'compression\' attribute has wrong data type");
    return eVar3;
  }
  local_20 = 0;
  if (in_RSI[6] == (uint8_t *)0x0) {
    if (local_1c == 0) {
      eVar3 = (**(code **)(in_RDI + 0x48))(in_RDI,0xd,"\'dataWindow\' attribute not found");
      return eVar3;
    }
    local_30 = (uint8_t *)0x0;
    local_28 = (uint8_t *)0x3f0000003f;
    local_20 = exr_attr_list_add_static_name
                         (in_stack_00000008,unaff_retaddr,
                          (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          (exr_attribute_type_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,in_RSI,
                          (exr_attribute_t **)defdw_1.max);
    if (local_20 != 0) {
      return local_20;
    }
    puVar1 = *(undefined8 **)(in_RSI[6] + 0x18);
    *puVar1 = local_30;
    puVar1[1] = local_28;
    in_RSI[0x12] = local_30;
    in_RSI[0x13] = local_28;
    local_20 = internal_exr_compute_tile_information(f,curpart,adddefault);
  }
  else if (*(int *)(in_RSI[6] + 0x14) != 1) {
    eVar3 = (**(code **)(in_RDI + 0x48))(in_RDI,0x10,"\'dataWindow\' attribute has wrong data type")
    ;
    return eVar3;
  }
  if (in_RSI[7] == (uint8_t *)0x0) {
    if (local_1c == 0) {
      eVar3 = (**(code **)(in_RDI + 0x48))(in_RDI,0xd,"\'displayWindow\' attribute not found");
      return eVar3;
    }
    local_40 = (uint8_t *)0x0;
    local_38 = (uint8_t *)0x3f0000003f;
    eVar3 = exr_attr_list_add_static_name
                      (in_stack_00000008,unaff_retaddr,
                       (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (exr_attribute_type_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,in_RSI,
                       (exr_attribute_t **)defdw_1.max);
    if (eVar3 != 0) {
      return eVar3;
    }
    puVar1 = *(undefined8 **)(in_RSI[7] + 0x18);
    *puVar1 = local_40;
    puVar1[1] = local_38;
    in_RSI[0x14] = local_40;
    in_RSI[0x15] = local_38;
    local_20 = 0;
  }
  else if (*(int *)(in_RSI[7] + 0x14) != 1) {
    eVar3 = (**(code **)(in_RDI + 0x48))
                      (in_RDI,0x10,"\'displayWindow\' attribute has wrong data type");
    return eVar3;
  }
  if (in_RSI[8] == (uint8_t *)0x0) {
    if (local_1c == 0) {
      eVar3 = (**(code **)(in_RDI + 0x48))(in_RDI,0xd,"\'lineOrder\' attribute not found");
      return eVar3;
    }
    eVar3 = exr_attr_list_add_static_name
                      (in_stack_00000008,unaff_retaddr,
                       (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (exr_attribute_type_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,in_RSI,
                       (exr_attribute_t **)defdw_1.max);
    if (eVar3 != 0) {
      return eVar3;
    }
    in_RSI[8][0x18] = '\0';
    *(undefined4 *)((long)in_RSI + 0xb4) = 0;
    local_20 = 0;
  }
  else if (*(int *)(in_RSI[8] + 0x14) != 0xc) {
    eVar3 = (**(code **)(in_RDI + 0x48))(in_RDI,0x10,"\'lineOrder\' attribute has wrong data type");
    return eVar3;
  }
  if (in_RSI[9] == (uint8_t *)0x0) {
    if (local_1c == 0) {
      eVar3 = (**(code **)(in_RDI + 0x48))(in_RDI,0xd,"\'pixelAspectRatio\' attribute not found");
      return eVar3;
    }
    eVar3 = exr_attr_list_add_static_name
                      (in_stack_00000008,unaff_retaddr,
                       (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (exr_attribute_type_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,in_RSI,
                       (exr_attribute_t **)defdw_1.max);
    if (eVar3 != 0) {
      return eVar3;
    }
    puVar2 = in_RSI[9];
    puVar2[0x18] = '\0';
    puVar2[0x19] = '\0';
    puVar2[0x1a] = 0x80;
    puVar2[0x1b] = '?';
    local_20 = 0;
  }
  else if (*(int *)(in_RSI[9] + 0x14) != 8) {
    eVar3 = (**(code **)(in_RDI + 0x48))
                      (in_RDI,0x10,"\'pixelAspectRatio\' attribute has wrong data type");
    return eVar3;
  }
  if (in_RSI[10] == (uint8_t *)0x0) {
    if (local_1c == 0) {
      eVar3 = (**(code **)(in_RDI + 0x48))(in_RDI,0xd,"\'screenWindowCenter\' attribute not found");
      return eVar3;
    }
    memset(&local_48,0,8);
    eVar3 = exr_attr_list_add_static_name
                      (in_stack_00000008,unaff_retaddr,
                       (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (exr_attribute_type_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,in_RSI,
                       (exr_attribute_t **)defdw_1.max);
    if (eVar3 != 0) {
      return eVar3;
    }
    **(undefined8 **)(in_RSI[10] + 0x18) = local_48;
    local_20 = 0;
  }
  else if (*(int *)(in_RSI[10] + 0x14) != 0x18) {
    eVar3 = (**(code **)(in_RDI + 0x48))
                      (in_RDI,0x10,"\'screenWindowCenter\' attribute has wrong data type");
    return eVar3;
  }
  if (in_RSI[0xb] == (uint8_t *)0x0) {
    if (local_1c == 0) {
      eVar3 = (**(code **)(in_RDI + 0x48))(in_RDI,0xd,"\'screenWindowWidth\' attribute not found");
      return eVar3;
    }
    eVar3 = exr_attr_list_add_static_name
                      (in_stack_00000008,unaff_retaddr,
                       (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (exr_attribute_type_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,in_RSI,
                       (exr_attribute_t **)defdw_1.max);
    if (eVar3 != 0) {
      return eVar3;
    }
    puVar2 = in_RSI[0xb];
    puVar2[0x18] = '\0';
    puVar2[0x19] = '\0';
    puVar2[0x1a] = 0x80;
    puVar2[0x1b] = '?';
    local_20 = 0;
  }
  else if (*(int *)(in_RSI[0xb] + 0x14) != 8) {
    eVar3 = (**(code **)(in_RDI + 0x48))
                      (in_RDI,0x10,
                       "\'screenWindowWidth\' attribute has wrong data type, expect float");
    return eVar3;
  }
  if ((*(char *)(in_RDI + 5) == '\0') && (*(char *)(in_RDI + 4) == '\0')) {
    return local_20;
  }
  if (*(char *)(in_RDI + 5) != '\0') {
    if (in_RSI[0xd] == (uint8_t *)0x0) {
      eVar3 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0xd,"\'name\' attribute for multipart file not found");
      return eVar3;
    }
    if (*(int *)(in_RSI[0xd] + 0x14) != 0x13) {
      eVar3 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0x10,"\'name\' attribute has wrong data type, expect string");
      return eVar3;
    }
  }
  if (in_RSI[0xe] == (uint8_t *)0x0) {
    local_20 = (**(code **)(in_RDI + 0x48))(in_RDI,0xd,"\'type\' attribute for v2+ file not found");
  }
  else if (*(int *)(in_RSI[0xe] + 0x14) == 0x13) {
    if ((*(char *)(in_RDI + 4) != '\0') && (in_RSI[0xf] == (uint8_t *)0x0)) {
      if (local_1c == 0) {
        eVar3 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0xd,"\'version\' attribute for deep file not found");
        return eVar3;
      }
      local_20 = exr_attr_list_add_static_name
                           (in_stack_00000008,unaff_retaddr,
                            (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            (exr_attribute_type_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,in_RSI,
                            (exr_attribute_t **)defdw_1.max);
      puVar2 = in_RSI[0xf];
      puVar2[0x18] = '\x01';
      puVar2[0x19] = '\0';
      puVar2[0x1a] = '\0';
      puVar2[0x1b] = '\0';
    }
    if ((*(char *)(in_RDI + 6) != '\0') && (in_RSI[0x10] == (uint8_t *)0x0)) {
      local_20 = (**(code **)(in_RDI + 0x48))
                           (in_RDI,0xd,
                            "\'chunkCount\' attribute for multipart / deep file not found");
    }
  }
  else {
    local_20 = (**(code **)(in_RDI + 0x48))
                         (in_RDI,0x10,"\'type\' attribute has wrong data type, expect string");
  }
  return local_20;
}

Assistant:

static exr_result_t
validate_req_attr (exr_context_t f, exr_priv_part_t curpart, int adddefault)
{
    exr_result_t rv = EXR_ERR_SUCCESS;

    if (!curpart->compression)
    {
        if (adddefault)
        {
            rv = exr_attr_list_add_static_name (
                (exr_context_t) f,
                &(curpart->attributes),
                "compression",
                EXR_ATTR_COMPRESSION,
                0,
                NULL,
                &(curpart->compression));
            if (rv != EXR_ERR_SUCCESS) return rv;
            curpart->compression->uc = (uint8_t) EXR_COMPRESSION_ZIP;
            curpart->comp_type       = EXR_COMPRESSION_ZIP;
        }
        else
        {
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'compression' attribute not found");
        }
    }
    else if (curpart->compression->type != EXR_ATTR_COMPRESSION)
        return f->print_error (
            f,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "'compression' attribute has wrong data type");

    if (!curpart->dataWindow)
    {
        if (adddefault)
        {
            exr_attr_box2i_t defdw = {{.x = 0, .y = 0}, {.x = 63, .y = 63}};
            rv                     = exr_attr_list_add_static_name (
                (exr_context_t) f,
                &(curpart->attributes),
                "dataWindow",
                EXR_ATTR_BOX2I,
                0,
                NULL,
                &(curpart->dataWindow));
            if (rv != EXR_ERR_SUCCESS) return rv;
            *(curpart->dataWindow->box2i) = defdw;
            curpart->data_window          = defdw;

            rv = internal_exr_compute_tile_information (f, curpart, 1);
        }
        else
        {
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'dataWindow' attribute not found");
        }
    }
    else if (curpart->dataWindow->type != EXR_ATTR_BOX2I)
        return f->print_error (
            f,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "'dataWindow' attribute has wrong data type");

    if (!curpart->displayWindow)
    {
        if (adddefault)
        {
            exr_attr_box2i_t defdw = {{.x = 0, .y = 0}, {.x = 63, .y = 63}};
            rv                     = exr_attr_list_add_static_name (
                (exr_context_t) f,
                &(curpart->attributes),
                "displayWindow",
                EXR_ATTR_BOX2I,
                0,
                NULL,
                &(curpart->displayWindow));
            if (rv != EXR_ERR_SUCCESS) return rv;
            *(curpart->displayWindow->box2i) = defdw;
            curpart->display_window          = defdw;
        }
        else
        {
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'displayWindow' attribute not found");
        }
    }
    else if (curpart->displayWindow->type != EXR_ATTR_BOX2I)
        return f->print_error (
            f,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "'displayWindow' attribute has wrong data type");

    if (!curpart->lineOrder)
    {
        if (adddefault)
        {
            rv = exr_attr_list_add_static_name (
                (exr_context_t) f,
                &(curpart->attributes),
                "lineOrder",
                EXR_ATTR_LINEORDER,
                0,
                NULL,
                &(curpart->lineOrder));
            if (rv != EXR_ERR_SUCCESS) return rv;
            curpart->lineOrder->uc = (uint8_t) EXR_LINEORDER_INCREASING_Y;
            curpart->lineorder     = EXR_LINEORDER_INCREASING_Y;
        }
        else
        {
            return f->print_error (
                f, EXR_ERR_MISSING_REQ_ATTR, "'lineOrder' attribute not found");
        }
    }
    else if (curpart->lineOrder->type != EXR_ATTR_LINEORDER)
        return f->print_error (
            f,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "'lineOrder' attribute has wrong data type");

    if (!curpart->pixelAspectRatio)
    {
        if (adddefault)
        {
            rv = exr_attr_list_add_static_name (
                (exr_context_t) f,
                &(curpart->attributes),
                "pixelAspectRatio",
                EXR_ATTR_FLOAT,
                0,
                NULL,
                &(curpart->pixelAspectRatio));
            if (rv != EXR_ERR_SUCCESS) return rv;
            curpart->pixelAspectRatio->f = 1.f;
        }
        else
        {
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'pixelAspectRatio' attribute not found");
        }
    }
    else if (curpart->pixelAspectRatio->type != EXR_ATTR_FLOAT)
        return f->print_error (
            f,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "'pixelAspectRatio' attribute has wrong data type");

    if (!curpart->screenWindowCenter)
    {
        if (adddefault)
        {
            exr_attr_v2f_t defswc = {.x = 0.f, .y = 0.f};
            rv                    = exr_attr_list_add_static_name (
                (exr_context_t) f,
                &(curpart->attributes),
                "screenWindowCenter",
                EXR_ATTR_V2F,
                0,
                NULL,
                &(curpart->screenWindowCenter));
            if (rv != EXR_ERR_SUCCESS) return rv;
            *(curpart->screenWindowCenter->v2f) = defswc;
        }
        else
        {
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'screenWindowCenter' attribute not found");
        }
    }
    else if (curpart->screenWindowCenter->type != EXR_ATTR_V2F)
        return f->print_error (
            f,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "'screenWindowCenter' attribute has wrong data type");

    if (!curpart->screenWindowWidth)
    {
        if (adddefault)
        {
            rv = exr_attr_list_add_static_name (
                (exr_context_t) f,
                &(curpart->attributes),
                "screenWindowWidth",
                EXR_ATTR_FLOAT,
                0,
                NULL,
                &(curpart->screenWindowWidth));
            if (rv != EXR_ERR_SUCCESS) return rv;
            curpart->screenWindowWidth->f = 1.f;
        }
        else
        {
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'screenWindowWidth' attribute not found");
        }
    }
    else if (curpart->screenWindowWidth->type != EXR_ATTR_FLOAT)
        return f->print_error (
            f,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "'screenWindowWidth' attribute has wrong data type, expect float");

    if (f->is_multipart || f->has_nonimage_data)
    {
        if (f->is_multipart)
        {
            if (!curpart->name)
                return f->print_error (
                    f,
                    EXR_ERR_MISSING_REQ_ATTR,
                    "'name' attribute for multipart file not found");
            else if (curpart->name->type != EXR_ATTR_STRING)
                return f->print_error (
                    f,
                    EXR_ERR_ATTR_TYPE_MISMATCH,
                    "'name' attribute has wrong data type, expect string");
        }
        if (!curpart->type)
        {
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'type' attribute for v2+ file not found");
        }
        else if (curpart->type->type != EXR_ATTR_STRING)
            return f->print_error (
                f,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'type' attribute has wrong data type, expect string");
        if (f->has_nonimage_data && !curpart->version)
        {
            if (adddefault)
            {
                rv = exr_attr_list_add_static_name (
                    f,
                    &(curpart->attributes),
                    EXR_REQ_VERSION_STR,
                    EXR_ATTR_INT,
                    0,
                    NULL,
                    &(curpart->version));
                curpart->version->i = 1;
            }
            else
            {
                return f->print_error (
                    f,
                    EXR_ERR_MISSING_REQ_ATTR,
                    "'version' attribute for deep file not found");
            }
        }
        if (f->strict_header && !curpart->chunkCount)
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'chunkCount' attribute for multipart / deep file not found");
    }

    return rv;
}